

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

int __thiscall
mp::internal::BinaryReader<mp::internal::IdentityConverter>::ReadUInt
          (BinaryReader<mp::internal::IdentityConverter> *this)

{
  int *piVar1;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  (this->super_BinaryReaderBase).super_ReaderBase.token_ =
       (this->super_BinaryReaderBase).super_ReaderBase.ptr_;
  piVar1 = (int *)BinaryReaderBase::Read(&this->super_BinaryReaderBase,4);
  if (-1 < *piVar1) {
    return *piVar1;
  }
  local_28 = 0;
  uStack_20 = 0;
  local_18.types_ = 0;
  local_18.field_1.values_ = (Value *)&local_28;
  BinaryReaderBase::ReportError(&this->super_BinaryReaderBase,(CStringRef)0x26c03c,&local_18);
}

Assistant:

int ReadUInt() {
    int value = ReadInt<int>();
    if (value < 0)
      ReportError("expected unsigned integer");
    return value;
  }